

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateExtension
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  Printer *this_00;
  bool bVar1;
  CppType CVar2;
  FieldDescriptor *pFVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  FileDescriptor *from_file;
  GeneratorOptions *extraout_RDX;
  GeneratorOptions *extraout_RDX_00;
  GeneratorOptions *options_00;
  AlphaNum *a;
  AlphaNum *a_00;
  GeneratorOptions *options_01;
  GeneratorOptions *options_02;
  AlphaNum *a_01;
  Descriptor *pDVar4;
  char (*args_9) [2];
  allocator local_1cd;
  CppType local_1cc;
  Printer *local_1c8;
  string local_1c0;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string extension_object_name;
  AlphaNum local_140;
  string extension_scope;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  pFVar3 = field;
  if (*(GeneratorOptions **)(field + 0x60) == (GeneratorOptions *)0x0) {
    (anonymous_namespace)::GetNamespace_abi_cxx11_
              (&extension_scope,(_anonymous_namespace_ *)options,
               *(GeneratorOptions **)(field + 0x28),(FileDescriptor *)field);
    options_00 = extraout_RDX_00;
  }
  else {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&extension_scope,(_anonymous_namespace_ *)options,
               *(GeneratorOptions **)(field + 0x60),(Descriptor *)field);
    options_00 = extraout_RDX;
  }
  (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
            (&extension_object_name,(_anonymous_namespace_ *)field,options_00,pFVar3);
  (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
            ((string *)&local_140,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
             (FieldDescriptor *)0x0,true,false,false,BYTES_DEFAULT,SUB81(options,0));
  args_1 = &extension_object_name;
  io::Printer::
  Print<char[14],std::__cxx11::string,char[5],std::__cxx11::string,char[6],std::__cxx11::string,char[14],std::__cxx11::string>
            (printer,
             "\n/**\n * A tuple of {field number, class constructor} for the extension\n * field named `$nameInComment$`.\n * @type {!jspb.ExtensionFieldInfo<$extensionType$>}\n */\n$class$.$name$ = new jspb.ExtensionFieldInfo(\n"
             ,(char (*) [14])"nameInComment",args_1,(char (*) [5])0x38d8c6,args_1,
             (char (*) [6])0x39aeed,&extension_scope,(char (*) [14])"extensionType",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"name",field);
  strings::AlphaNum::AlphaNum(&local_140,*(int *)(field + 0x44));
  StrCat_abi_cxx11_(&local_1a0,(protobuf *)&local_140,a);
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 == CPPTYPE_MESSAGE) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (&local_1c0,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)args_1);
  }
  else {
    std::__cxx11::string::string((string *)&local_1c0,"null",&local_1cd);
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  local_1c8 = printer;
  if (CVar2 == CPPTYPE_MESSAGE) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (&local_70,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)args_1);
    std::operator+(&local_180,&local_70,".toObject");
  }
  else {
    std::__cxx11::string::string((string *)&local_180,"null",(allocator *)&local_70);
  }
  args_9 = (char (*) [2])0x393df4;
  if (*(int *)(field + 0x3c) == 3) {
    args_9 = (char (*) [2])0x394db6;
  }
  pDVar4 = (Descriptor *)0x38d8c6;
  io::Printer::
  Print<char[6],std::__cxx11::string,char[5],std::__cxx11::string,char[5],std::__cxx11::string,char[9],std::__cxx11::string,char[9],char[2]>
            (local_1c8,
             "    $index$,\n    {$name$: 0},\n    $ctor$,\n     /** @type {?function((boolean|undefined),!jspb.Message=): !Object} */ (\n         $toObject$),\n    $repeated$);\n"
             ,(char (*) [6])0x3a0f1a,&local_1a0,(char (*) [5])0x38d8c6,&extension_object_name,
             (char (*) [5])0x399837,&local_1c0,(char (*) [9])0x394583,&local_180,
             (char (*) [9])"repeated",args_9);
  std::__cxx11::string::~string((string *)&local_180);
  if (CVar2 == CPPTYPE_MESSAGE) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  from_file = *(FileDescriptor **)(field + 0x50);
  (anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
            (&local_1a0,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x28),
             from_file,pDVar4);
  strings::AlphaNum::AlphaNum(&local_140,*(int *)(field + 0x44));
  StrCat_abi_cxx11_(&local_1c0,(protobuf *)&local_140,a_00);
  (anonymous_namespace)::JSBinaryReaderMethodName_abi_cxx11_
            (&local_180,(_anonymous_namespace_ *)field,options_01,(FieldDescriptor *)from_file);
  (anonymous_namespace)::JSBinaryWriterMethodName_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)field,options_02,(FieldDescriptor *)from_file);
  local_1cc = FieldDescriptor::cpp_type(field);
  if (local_1cc == CPPTYPE_MESSAGE) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (&local_b0,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)from_file);
    std::operator+(&local_90,&local_b0,".serializeBinaryToWriter");
  }
  else {
    std::__cxx11::string::string((string *)&local_90,"undefined",(allocator *)&local_b0);
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 == CPPTYPE_MESSAGE) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (&local_f0,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)from_file);
    std::operator+(&local_d0,&local_f0,".deserializeBinaryFromReader");
  }
  else {
    std::__cxx11::string::string((string *)&local_d0,"undefined",(allocator *)&local_f0);
  }
  pDVar4 = (Descriptor *)0x3a0f1a;
  io::Printer::
  Print<char[11],std::__cxx11::string,char[6],std::__cxx11::string,char[6],std::__cxx11::string,char[5],std::__cxx11::string,char[15],std::__cxx11::string,char[15],std::__cxx11::string,char[25],std::__cxx11::string,char[27],std::__cxx11::string>
            (local_1c8,
             "\n$extendName$Binary[$index$] = new jspb.ExtensionFieldBinaryInfo(\n    $class$.$name$,\n    $binaryReaderFn$,\n    $binaryWriterFn$,\n    $binaryMessageSerializeFn$,\n    $binaryMessageDeserializeFn$,\n"
             ,(char (*) [11])"extendName",&local_1a0,(char (*) [6])0x3a0f1a,&local_1c0,
             (char (*) [6])0x39aeed,&extension_scope,(char (*) [5])0x38d8c6,&extension_object_name,
             (char (*) [15])"binaryReaderFn",&local_180,(char (*) [15])"binaryWriterFn",&local_50,
             (char (*) [25])"binaryMessageSerializeFn",&local_90,
             (char (*) [27])"binaryMessageDeserializeFn",&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  if (CVar2 == CPPTYPE_MESSAGE) {
    std::__cxx11::string::~string((string *)&local_f0);
  }
  this_00 = local_1c8;
  std::__cxx11::string::~string((string *)&local_90);
  if (local_1cc == CPPTYPE_MESSAGE) {
    std::__cxx11::string::~string((string *)&local_b0);
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  bVar1 = FieldDescriptor::is_packed(field);
  local_140.piece_data_ = "false";
  if (bVar1) {
    local_140.piece_data_ = "true";
  }
  io::Printer::Print<char[9],char_const*>
            (this_00,"    $isPacked$);\n",(char (*) [9])"isPacked",&local_140.piece_data_);
  (anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
            (&local_1a0,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x28),
             *(FileDescriptor **)(field + 0x50),pDVar4);
  strings::AlphaNum::AlphaNum(&local_140,*(int *)(field + 0x44));
  StrCat_abi_cxx11_(&local_1c0,(protobuf *)&local_140,a_01);
  io::Printer::
  Print<char[11],std::__cxx11::string,char[6],std::__cxx11::string,char[6],std::__cxx11::string,char[5],std::__cxx11::string>
            (this_00,
             "// This registers the extension field with the extended class, so that\n// toObject() will function correctly.\n$extendName$[$index$] = $class$.$name$;\n\n"
             ,(char (*) [11])"extendName",&local_1a0,(char (*) [6])0x3a0f1a,&local_1c0,
             (char (*) [6])0x39aeed,&extension_scope,(char (*) [5])0x38d8c6,&extension_object_name);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&extension_object_name);
  std::__cxx11::string::~string((string *)&extension_scope);
  return;
}

Assistant:

void Generator::GenerateExtension(const GeneratorOptions& options,
                                  io::Printer* printer,
                                  const FieldDescriptor* field) const {
  std::string extension_scope =
      (field->extension_scope()
           ? GetMessagePath(options, field->extension_scope())
           : GetNamespace(options, field->file()));

  const std::string extension_object_name = JSObjectFieldName(options, field);
  printer->Print(
      "\n"
      "/**\n"
      " * A tuple of {field number, class constructor} for the extension\n"
      " * field named `$nameInComment$`.\n"
      " * @type {!jspb.ExtensionFieldInfo<$extensionType$>}\n"
      " */\n"
      "$class$.$name$ = new jspb.ExtensionFieldInfo(\n",
      "nameInComment", extension_object_name, "name", extension_object_name,
      "class", extension_scope, "extensionType",
      JSFieldTypeAnnotation(options, field,
                            /* is_setter_argument = */ false,
                            /* force_present = */ true,
                            /* singular_if_not_packed = */ false));
  printer->Annotate("name", field);
  printer->Print(
      "    $index$,\n"
      "    {$name$: 0},\n"
      "    $ctor$,\n"
      "     /** @type {?function((boolean|undefined),!jspb.Message=): "
      "!Object} */ (\n"
      "         $toObject$),\n"
      "    $repeated$);\n",
      "index", StrCat(field->number()), "name", extension_object_name,
      "ctor",
      (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE
           ? SubmessageTypeRef(options, field)
           : std::string("null")),
      "toObject",
      (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE
           ? (SubmessageTypeRef(options, field) + ".toObject")
           : std::string("null")),
      "repeated", (field->is_repeated() ? "1" : "0"));

  printer->Print(
      "\n"
      "$extendName$Binary[$index$] = new jspb.ExtensionFieldBinaryInfo(\n"
      "    $class$.$name$,\n"
      "    $binaryReaderFn$,\n"
      "    $binaryWriterFn$,\n"
      "    $binaryMessageSerializeFn$,\n"
      "    $binaryMessageDeserializeFn$,\n",
      "extendName",
      JSExtensionsObjectName(options, field->file(), field->containing_type()),
      "index", StrCat(field->number()), "class", extension_scope, "name",
      extension_object_name, "binaryReaderFn",
      JSBinaryReaderMethodName(options, field), "binaryWriterFn",
      JSBinaryWriterMethodName(options, field), "binaryMessageSerializeFn",
      (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE)
          ? (SubmessageTypeRef(options, field) + ".serializeBinaryToWriter")
          : "undefined",
      "binaryMessageDeserializeFn",
      (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE)
          ? (SubmessageTypeRef(options, field) + ".deserializeBinaryFromReader")
          : "undefined");

  printer->Print("    $isPacked$);\n", "isPacked",
                 (field->is_packed() ? "true" : "false"));

  printer->Print(
      "// This registers the extension field with the extended class, so that\n"
      "// toObject() will function correctly.\n"
      "$extendName$[$index$] = $class$.$name$;\n"
      "\n",
      "extendName",
      JSExtensionsObjectName(options, field->file(), field->containing_type()),
      "index", StrCat(field->number()), "class", extension_scope, "name",
      extension_object_name);
}